

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

int rsa1_load_f(Filename *filename,RSAKey *key,char *passphrase,char **errstr)

{
  LoadedFile *lf_00;
  int toret;
  LoadedFile *lf;
  char **errstr_local;
  char *passphrase_local;
  RSAKey *key_local;
  Filename *filename_local;
  
  lf_00 = lf_load_keyfile(filename,errstr);
  if (lf_00 == (LoadedFile *)0x0) {
    filename_local._4_4_ = 0;
  }
  else {
    filename_local._4_4_ = rsa1_load_s(lf_00->binarysource_,key,passphrase,errstr);
    lf_free(lf_00);
  }
  return filename_local._4_4_;
}

Assistant:

int rsa1_load_f(const Filename *filename, RSAKey *key,
                const char *passphrase, const char **errstr)
{
    LoadedFile *lf = lf_load_keyfile(filename, errstr);
    if (!lf)
        return false;

    int toret = rsa1_load_s(BinarySource_UPCAST(lf), key, passphrase, errstr);
    lf_free(lf);
    return toret;
}